

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O3

cupdlp_int cupdlp_twoNorm(CUPDLPwork *w,cupdlp_int n,cupdlp_float *x,cupdlp_float *res)

{
  ulong uVar1;
  double __x;
  cupdlp_float cVar2;
  
  __x = 0.0;
  if (0 < n) {
    uVar1 = 0;
    do {
      __x = __x + x[uVar1] * x[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)n != uVar1);
  }
  if (__x < 0.0) {
    cVar2 = sqrt(__x);
  }
  else {
    cVar2 = SQRT(__x);
  }
  *res = cVar2;
  return 0;
}

Assistant:

cupdlp_int cupdlp_twoNorm(CUPDLPwork *w, const cupdlp_int n,
                          const cupdlp_float *x, cupdlp_float *res) {
#ifndef CUPDLP_CPU
#ifndef SFLOAT
  CHECK_CUBLAS(cublasDnrm2(w->cublashandle, n, x, 1, res));
#else
  CHECK_CUBLAS(cublasSnrm2(w->cublashandle, n, x, 1, res));
#endif
#else
  *res = nrm2(n, x, 1);
#endif
  return 0;
}